

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

void __thiscall cfd::core::SchnorrSignature::SchnorrSignature(SchnorrSignature *this,ByteData *data)

{
  bool bVar1;
  size_t sVar2;
  reference pvVar3;
  CfdException *pCVar4;
  uchar *buffer;
  allocator local_a9;
  string local_a8;
  ByteData local_88;
  undefined1 local_6a;
  allocator local_69;
  string local_68;
  uint8_t local_41;
  undefined1 local_40 [7];
  uint8_t sighash_type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  ByteData *data_local;
  SchnorrSignature *this_local;
  
  ByteData::ByteData(&this->data_,data);
  SigHashType::SigHashType(&this->sighash_type_,kSigHashDefault,false,false);
  sVar2 = ByteData::GetDataSize(&this->data_);
  if (sVar2 == 0x41) {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,data);
    pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0x40);
    local_41 = *pvVar3;
    if ((local_41 == '\0') || (bVar1 = IsValidSigHashType(local_41), !bVar1)) {
      local_6a = 1;
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_68,"Invalid Schnorr signature hash type.",&local_69);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_68);
      local_6a = 0;
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    SigHashType::SetFromSigHashFlag(&this->sighash_type_,local_41);
    buffer = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    ByteData::ByteData(&local_88,buffer,0x40);
    ByteData::operator=(&this->data_,&local_88);
    ByteData::~ByteData(&local_88);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  else {
    sVar2 = ByteData::GetDataSize(&this->data_);
    if (sVar2 != 0x40) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_a8,"Invalid Schnorr signature data.",&local_a9);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_a8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return;
}

Assistant:

SchnorrSignature::SchnorrSignature(const ByteData &data)
    : data_(data), sighash_type_(SigHashAlgorithm::kSigHashDefault) {
  if (data_.GetDataSize() == SchnorrSignature::kSchnorrSignatureSize + 1) {
    auto bytes = data.GetBytes();
    uint8_t sighash_type = bytes[SchnorrSignature::kSchnorrSignatureSize];
    if ((sighash_type == 0) || (!IsValidSigHashType(sighash_type))) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid Schnorr signature hash type.");
    }
    sighash_type_.SetFromSigHashFlag(sighash_type);
    data_ = ByteData(bytes.data(), SchnorrSignature::kSchnorrSignatureSize);
  } else if (data_.GetDataSize() != SchnorrSignature::kSchnorrSignatureSize) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Schnorr signature data.");
  }
}